

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::CountVerticesAndFaces
          (PretransformVertices *this,aiScene *pcScene,aiNode *pcNode,uint iMat,uint iVFormat,
          uint *piFaces,uint *piVertices)

{
  aiMesh *pcMesh_00;
  uint uVar1;
  uint local_44;
  uint i_1;
  aiMesh *pcMesh;
  uint i;
  uint *piFaces_local;
  uint iVFormat_local;
  uint iMat_local;
  aiNode *pcNode_local;
  aiScene *pcScene_local;
  PretransformVertices *this_local;
  
  for (pcMesh._4_4_ = 0; pcMesh._4_4_ < pcNode->mNumMeshes; pcMesh._4_4_ = pcMesh._4_4_ + 1) {
    pcMesh_00 = pcScene->mMeshes[pcNode->mMeshes[pcMesh._4_4_]];
    if (iMat == pcMesh_00->mMaterialIndex) {
      uVar1 = GetMeshVFormat(this,pcMesh_00);
      if (iVFormat == uVar1) {
        *piVertices = pcMesh_00->mNumVertices + *piVertices;
        *piFaces = pcMesh_00->mNumFaces + *piFaces;
      }
    }
  }
  for (local_44 = 0; local_44 < pcNode->mNumChildren; local_44 = local_44 + 1) {
    CountVerticesAndFaces(this,pcScene,pcNode->mChildren[local_44],iMat,iVFormat,piFaces,piVertices)
    ;
  }
  return;
}

Assistant:

void PretransformVertices::CountVerticesAndFaces(const aiScene *pcScene, const aiNode *pcNode, unsigned int iMat,
		unsigned int iVFormat, unsigned int *piFaces, unsigned int *piVertices) const {
	for (unsigned int i = 0; i < pcNode->mNumMeshes; ++i) {
		aiMesh *pcMesh = pcScene->mMeshes[pcNode->mMeshes[i]];
		if (iMat == pcMesh->mMaterialIndex && iVFormat == GetMeshVFormat(pcMesh)) {
			*piVertices += pcMesh->mNumVertices;
			*piFaces += pcMesh->mNumFaces;
		}
	}
	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		CountVerticesAndFaces(pcScene, pcNode->mChildren[i], iMat,
				iVFormat, piFaces, piVertices);
	}
}